

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O3

void tcu::separableConvolve<4,4>
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,int shiftX,int shiftY,
               vector<float,_std::allocator<float>_> *kernelX,
               vector<float,_std::allocator<float>_> *kernelY)

{
  float fVar1;
  undefined4 uVar2;
  pointer pfVar3;
  pointer pfVar4;
  void *pvVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  ulong uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  float fVar27;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  PixelBufferAccess tmpAccess;
  TextureLevel tmp;
  int local_d4;
  long local_d0;
  PixelBufferAccess local_80;
  TextureLevel local_58;
  
  TextureLevel::TextureLevel
            (&local_58,(TextureFormat *)dst,(dst->super_ConstPixelBufferAccess).m_size.m_data[1],
             (dst->super_ConstPixelBufferAccess).m_size.m_data[0],1);
  TextureLevel::getAccess(&local_80,&local_58);
  iVar19 = (src->m_size).m_data[1];
  if (0 < iVar19) {
    pfVar3 = (kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar21 = (ulong)((long)(kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar3) >> 2;
    pfVar4 = (kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = (ulong)((long)(kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pfVar4) >> 2;
    iVar25 = (src->m_size).m_data[0];
    uVar15 = (uint)uVar21;
    local_d0 = 0;
    do {
      if (0 < iVar25) {
        pvVar5 = src->m_data;
        iVar18 = 0;
        iVar19 = -shiftX;
        do {
          if ((int)uVar15 < 1) {
            auVar28 = (undefined1  [16])0x0;
          }
          else {
            fVar27 = 0.0;
            fVar30 = 0.0;
            fVar31 = 0.0;
            fVar32 = 0.0;
            uVar24 = (ulong)(uVar15 & 0x7fffffff);
            iVar26 = iVar19;
            lVar22 = uVar21 << 0x20;
            do {
              lVar22 = lVar22 + -0x100000000;
              iVar16 = iVar25 + -1;
              if (iVar26 < iVar25 + -1) {
                iVar16 = iVar26;
              }
              iVar16 = iVar16 << 2;
              if (iVar26 < 0) {
                iVar16 = 0;
              }
              uVar2 = *(undefined4 *)
                       ((long)pvVar5 +
                       (long)iVar16 + (long)((src->m_pitch).m_data[1] * (int)local_d0));
              uVar12 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
              auVar6._8_4_ = 0;
              auVar6._0_8_ = uVar12;
              auVar6[0xc] = (char)((uint)uVar2 >> 0x18);
              auVar7[8] = (char)((uint)uVar2 >> 0x10);
              auVar7._0_8_ = uVar12;
              auVar7[9] = 0;
              auVar7._10_3_ = auVar6._10_3_;
              auVar13._5_8_ = 0;
              auVar13._0_5_ = auVar7._8_5_;
              auVar8[4] = (char)((uint)uVar2 >> 8);
              auVar8._0_4_ = (int)uVar12;
              auVar8[5] = 0;
              auVar8._6_7_ = SUB137(auVar13 << 0x40,6);
              fVar1 = *(float *)((long)pfVar3 + (lVar22 >> 0x1e));
              fVar27 = fVar27 + fVar1 * (float)(int)uVar12;
              fVar30 = fVar30 + fVar1 * (float)auVar8._4_4_;
              fVar31 = fVar31 + fVar1 * (float)auVar7._8_4_;
              fVar32 = fVar32 + fVar1 * (float)(uint3)(auVar6._10_3_ >> 0x10);
              iVar26 = iVar26 + 1;
              uVar24 = uVar24 - 1;
            } while (uVar24 != 0);
            auVar28._0_4_ = (int)(fVar27 + 0.5);
            auVar28._4_4_ = (int)(fVar30 + 0.5);
            auVar28._8_4_ = (int)(fVar31 + 0.5);
            auVar28._12_4_ = (int)(fVar32 + 0.5);
          }
          uVar20 = auVar28._0_4_;
          if (0xfe < (int)uVar20) {
            uVar20 = 0xff;
          }
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          iVar25 = auVar28._4_4_;
          iVar26 = auVar28._8_4_;
          iVar16 = auVar28._12_4_;
          if (0xfe < iVar25) {
            iVar25 = 0xff;
          }
          if (iVar25 < 1) {
            iVar25 = 0;
          }
          if (0xfe < iVar26) {
            iVar26 = 0xff;
          }
          if (iVar26 < 1) {
            iVar26 = 0;
          }
          if (0xfe < iVar16) {
            iVar16 = 0xff;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          *(uint *)((long)local_80.super_ConstPixelBufferAccess.m_data +
                   (long)(local_80.super_ConstPixelBufferAccess.m_pitch.m_data[1] * iVar18) +
                   (long)((int)local_d0 * 4)) =
               iVar16 << 0x18 | iVar26 << 0x10 | iVar25 << 8 | uVar20;
          iVar18 = iVar18 + 1;
          iVar25 = (src->m_size).m_data[0];
          iVar19 = iVar19 + 1;
        } while (iVar18 < iVar25);
        iVar19 = (src->m_size).m_data[1];
      }
      local_d0 = local_d0 + 1;
    } while (local_d0 < iVar19);
    if (0 < iVar19) {
      pvVar5 = (dst->super_ConstPixelBufferAccess).m_data;
      uVar21 = (ulong)(uint)(src->m_size).m_data[0];
      uVar15 = (uint)uVar17;
      local_d4 = -shiftY;
      iVar25 = 0;
      do {
        if (0 < (int)uVar21) {
          lVar22 = 0;
          do {
            if ((int)uVar15 < 1) {
              auVar29 = (undefined1  [16])0x0;
            }
            else {
              fVar27 = 0.0;
              fVar30 = 0.0;
              fVar31 = 0.0;
              fVar32 = 0.0;
              uVar21 = (ulong)(uVar15 & 0x7fffffff);
              iVar19 = local_d4;
              lVar23 = uVar17 << 0x20;
              do {
                lVar23 = lVar23 + -0x100000000;
                iVar18 = local_58.m_size.m_data[0] + -1;
                if (iVar19 < local_58.m_size.m_data[0] + -1) {
                  iVar18 = iVar19;
                }
                iVar18 = iVar18 << 2;
                if (iVar19 < 0) {
                  iVar18 = 0;
                }
                uVar2 = *(undefined4 *)
                         ((long)local_80.super_ConstPixelBufferAccess.m_data +
                         (long)iVar18 +
                         (long)(local_80.super_ConstPixelBufferAccess.m_pitch.m_data[1] *
                               (int)lVar22));
                uVar24 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
                auVar9._8_4_ = 0;
                auVar9._0_8_ = uVar24;
                auVar9[0xc] = (char)((uint)uVar2 >> 0x18);
                auVar10[8] = (char)((uint)uVar2 >> 0x10);
                auVar10._0_8_ = uVar24;
                auVar10[9] = 0;
                auVar10._10_3_ = auVar9._10_3_;
                auVar14._5_8_ = 0;
                auVar14._0_5_ = auVar10._8_5_;
                auVar11[4] = (char)((uint)uVar2 >> 8);
                auVar11._0_4_ = (int)uVar24;
                auVar11[5] = 0;
                auVar11._6_7_ = SUB137(auVar14 << 0x40,6);
                fVar1 = *(float *)((long)pfVar4 + (lVar23 >> 0x1e));
                fVar27 = fVar27 + fVar1 * (float)(int)uVar24;
                fVar30 = fVar30 + fVar1 * (float)auVar11._4_4_;
                fVar31 = fVar31 + fVar1 * (float)auVar10._8_4_;
                fVar32 = fVar32 + fVar1 * (float)(uint3)(auVar9._10_3_ >> 0x10);
                iVar19 = iVar19 + 1;
                uVar21 = uVar21 - 1;
              } while (uVar21 != 0);
              auVar29._0_4_ = (int)(fVar27 + 0.5);
              auVar29._4_4_ = (int)(fVar30 + 0.5);
              auVar29._8_4_ = (int)(fVar31 + 0.5);
              auVar29._12_4_ = (int)(fVar32 + 0.5);
            }
            uVar20 = auVar29._0_4_;
            if (0xfe < (int)uVar20) {
              uVar20 = 0xff;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            iVar26 = auVar29._4_4_;
            iVar19 = auVar29._8_4_;
            iVar18 = auVar29._12_4_;
            if (0xfe < iVar26) {
              iVar26 = 0xff;
            }
            if (iVar26 < 1) {
              iVar26 = 0;
            }
            if (0xfe < iVar19) {
              iVar19 = 0xff;
            }
            if (iVar19 < 1) {
              iVar19 = 0;
            }
            if (0xfe < iVar18) {
              iVar18 = 0xff;
            }
            if (iVar18 < 1) {
              iVar18 = 0;
            }
            *(uint *)((long)pvVar5 +
                     (long)((int)lVar22 << 2) +
                     (long)((dst->super_ConstPixelBufferAccess).m_pitch.m_data[1] * iVar25)) =
                 iVar18 << 0x18 | iVar19 << 0x10 | iVar26 << 8 | uVar20;
            lVar22 = lVar22 + 1;
            uVar21 = (ulong)(src->m_size).m_data[0];
          } while (lVar22 < (long)uVar21);
          iVar19 = (src->m_size).m_data[1];
        }
        iVar25 = iVar25 + 1;
        local_d4 = local_d4 + 1;
      } while (iVar25 < iVar19);
    }
  }
  TextureLevel::~TextureLevel(&local_58);
  return;
}

Assistant:

static void separableConvolve (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, int shiftX, int shiftY, const std::vector<float>& kernelX, const std::vector<float>& kernelY)
{
	DE_ASSERT(dst.getWidth() == src.getWidth() && dst.getHeight() == src.getHeight());

	TextureLevel		tmp			(dst.getFormat(), dst.getHeight(), dst.getWidth());
	PixelBufferAccess	tmpAccess	= tmp.getAccess();

	int kw = (int)kernelX.size();
	int kh = (int)kernelY.size();

	// Horizontal pass
	// \note Temporary surface is written in column-wise order
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0);

			for (int kx = 0; kx < kw; kx++)
			{
				float		f = kernelX[kw-kx-1];
				deUint32	p = readUnorm8<SrcChannels>(src, de::clamp(i+kx-shiftX, 0, src.getWidth()-1), j);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(tmpAccess, j, i, toColor(sum));
		}
	}

	// Vertical pass
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0.0f);

			for (int ky = 0; ky < kh; ky++)
			{
				float		f = kernelY[kh-ky-1];
				deUint32	p = readUnorm8<DstChannels>(tmpAccess, de::clamp(j+ky-shiftY, 0, tmp.getWidth()-1), i);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(dst, i, j, toColor(sum));
		}
	}
}